

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translator.cpp
# Opt level: O2

void __thiscall Translator::visit(Translator *this,FunctionNode *functionNode)

{
  int iVar1;
  FrameMIPS *pFVar2;
  Temp *this_00;
  FunctionSymbol *pFVar3;
  Procedure *this_01;
  SEQ *this_02;
  SEQ *this_03;
  LABEL *pLVar4;
  Label *pLVar5;
  undefined4 extraout_var;
  char endFuncLabel [50];
  
  pFVar2 = (FrameMIPS *)operator_new(0x30);
  FrameMIPS::FrameMIPS(pFVar2,(Label *)0x0,(Temp *)0x0,(AccessList *)0x0);
  this->currentFrame = pFVar2;
  this_00 = (Temp *)operator_new(0x10);
  Temp::Temp(this_00);
  pFVar2->returnValue = this_00;
  if ((functionNode != (FunctionNode *)0x0) && (functionNode->id != (TokenNode *)0x0)) {
    pFVar3 = FunctionTable::cSearch(this->functionTable,(functionNode->id->super_ExpNode).lexeme);
    this->activeFunction = pFVar3;
  }
  if (functionNode->parameters != (FormalListNode *)0x0) {
    visit(this,functionNode->parameters);
  }
  if (functionNode->local != (VarDeclNode *)0x0) {
    visit(this,functionNode->local);
  }
  sprintf(endFuncLabel,"%s_end",(functionNode->id->super_ExpNode).lexeme);
  pFVar2 = this->currentFrame;
  if (pFVar2 != (FrameMIPS *)0x0 && functionNode->body != (StmtListNode *)0x0) {
    this_01 = (Procedure *)operator_new(0x20);
    this_02 = (SEQ *)operator_new(0x20);
    this_03 = (SEQ *)operator_new(0x20);
    pLVar4 = (LABEL *)operator_new(0x18);
    pLVar5 = (Label *)operator_new(0x10);
    Label::Label(pLVar5,(functionNode->id->super_ExpNode).lexeme);
    LABEL::LABEL(pLVar4,pLVar5);
    iVar1 = (*(functionNode->body->super_StmtNode).super_ASTNode._vptr_ASTNode[4])
                      (functionNode->body,this);
    SEQ::SEQ(this_03,(StmNode *)pLVar4,(StmNode *)CONCAT44(extraout_var,iVar1));
    pLVar4 = (LABEL *)operator_new(0x18);
    pLVar5 = (Label *)operator_new(0x10);
    Label::Label(pLVar5,endFuncLabel);
    LABEL::LABEL(pLVar4,pLVar5);
    SEQ::SEQ(this_02,(StmNode *)this_03,(StmNode *)pLVar4);
    Procedure::Procedure(this_01,&pFVar2->super_Frame,(StmNode *)this_02);
    (this_01->super_Fragment).next = this->fragmentList;
    this->fragmentList = (Fragment *)this_01;
  }
  return;
}

Assistant:

void Translator::visit(FunctionNode *functionNode) {
    currentFrame = new FrameMIPS(nullptr, nullptr, nullptr);
    currentFrame->setReturnValue(new Temp());// marcando o temporario pra onde retornar

    if (functionNode && functionNode->getId()) {
        this->activeFunction = functionTable->cSearch(functionNode->getId()->getLexeme());
    }

    if (functionNode->getParameters()) {
        functionNode->getParameters()->accept(this);
    }
    if (functionNode->getLocal()) {
        functionNode->getLocal()->accept(this);
    }

    char endFuncLabel[50];
    sprintf(endFuncLabel, "%s_end", functionNode->getId()->getLexeme());

    if (functionNode->getBody() && currentFrame) {
        Procedure *procedure = new Procedure(currentFrame,
                                             new SEQ(new SEQ(new LABEL(new Label(functionNode->getId()->getLexeme())),
                                                             functionNode->getBody()->accept(this)),
                                                     new LABEL(new Label(endFuncLabel))));
        procedure->setNext(fragmentList);
        fragmentList = procedure;
    }
}